

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

ssize_t __thiscall
httplib::detail::BufferStream::read(BufferStream *this,int __fd,void *__buf,size_t __nbytes)

{
  long extraout_RAX;
  undefined4 in_register_00000034;
  
  std::__cxx11::string::copy((char *)&this->buffer,CONCAT44(in_register_00000034,__fd),(ulong)__buf)
  ;
  this->position = this->position + extraout_RAX;
  return extraout_RAX;
}

Assistant:

inline ssize_t BufferStream::read(char *ptr, size_t size) {
#if defined(_MSC_VER) && _MSC_VER <= 1900
			auto len_read = buffer._Copy_s(ptr, size, size, position);
#else
			auto len_read = buffer.copy(ptr, size, position);
#endif
			position += static_cast<size_t>(len_read);
			return static_cast<ssize_t>(len_read);
		}